

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

int __thiscall phosg::StringReader::truncate(StringReader *this,char *__file,__off_t __length)

{
  int in_EAX;
  invalid_argument *this_00;
  
  if (__file <= (char *)this->length) {
    this->length = (size_t)__file;
    return in_EAX;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::invalid_argument::invalid_argument(this_00,"StringReader contents cannot be extended");
  __cxa_throw(this_00,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument)
  ;
}

Assistant:

void StringReader::truncate(size_t new_size) {
  if (this->length < new_size) {
    throw invalid_argument("StringReader contents cannot be extended");
  }
  this->length = new_size;
}